

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O0

void __thiscall
GrcManager::WalkTableElement
          (GrcManager *this,RefAST *ast,TableType tblt,GdlRuleTable *prultbl,GdlPass *ppass)

{
  undefined4 in_EDX;
  GrcManager *in_RSI;
  GdlPass *unaff_retaddr;
  GdlRuleTable *in_stack_00000008;
  TableType in_stack_00000014;
  RefAST *in_stack_00000018;
  GrcManager *in_stack_00000020;
  RefAST *in_stack_00000068;
  GrcManager *in_stack_00000070;
  GdlPass *in_stack_00000098;
  GdlRuleTable *in_stack_000000a0;
  RefAST *in_stack_000000a8;
  GrcManager *in_stack_000000b0;
  int nodetyp;
  GdlPass *in_stack_00000148;
  GdlRuleTable *in_stack_00000150;
  RefAST *in_stack_00000158;
  GrcManager *in_stack_00000160;
  RefAST *in_stack_00000188;
  GrcManager *in_stack_00000190;
  RefAST *in_stack_00000388;
  GrcManager *in_stack_00000390;
  GdlPass *in_stack_000004b8;
  GdlRuleTable *in_stack_000004c0;
  RefAST *in_stack_000004c8;
  GrcManager *in_stack_000004d0;
  int *in_stack_00000538;
  int *in_stack_00000540;
  int *in_stack_00000548;
  int *in_stack_00000550;
  RefAST *in_stack_00000558;
  GrcManager *in_stack_00000560;
  RefCount<AST> *in_stack_ffffffffffffff00;
  RefCount<AST> *this_00;
  RefCount<AST> *in_stack_ffffffffffffff08;
  RefCount<AST> *in_stack_ffffffffffffff10;
  RefAST *in_stack_ffffffffffffff38;
  GrcManager *in_stack_ffffffffffffff40;
  RefCount<AST> local_88;
  RefCount<AST> local_80;
  RefCount<AST> local_78 [9];
  int local_2c;
  undefined4 in_stack_ffffffffffffffe8;
  
  RefCount<AST>::operator->((RefCount<AST> *)in_RSI);
  local_2c = AST::getType((AST *)0x2665ba);
  if (local_2c == 9) {
    RefCount<AST>::RefCount(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    WalkEnvTree(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008,
                unaff_retaddr);
    RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
  }
  else if (local_2c == 0xe) {
    RefCount<AST>::RefCount(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    WalkTableTree(in_stack_00000070,in_stack_00000068);
    RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
  }
  else if (local_2c == 0x26) {
    RefCount<AST>::RefCount(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    WalkPassTree(in_stack_000004d0,in_stack_000004c8,in_stack_000004c0,in_stack_000004b8);
    RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
  }
  else if (local_2c == 0x59) {
    RefCount<AST>::RefCount(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    WalkDirectivesTree(in_stack_00000560,in_stack_00000558,in_stack_00000550,in_stack_00000548,
                       in_stack_00000540,in_stack_00000538);
    RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
  }
  else if (local_2c == 0x5d) {
    RefCount<AST>::RefCount(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    WalkIfTree(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
    RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
  }
  else if (local_2c == 0x61) {
    RefCount<AST>::RefCount(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    WalkRuleTree(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148);
    RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
  }
  else {
    switch(in_EDX) {
    case 1:
      this_00 = &local_88;
      RefCount<AST>::RefCount(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      WalkNameTableElement(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      RefCount<AST>::~RefCount(this_00);
      break;
    case 2:
      RefCount<AST>::RefCount(local_78,in_stack_ffffffffffffff08);
      WalkFeatureTableElement(in_stack_00000190,in_stack_00000188);
      RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
      break;
    case 3:
      RefCount<AST>::RefCount(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      WalkGlyphTableElement(in_stack_00000390,in_stack_00000388);
      RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
      break;
    case 4:
      break;
    case 5:
      RefCount<AST>::RefCount(in_stack_ffffffffffffff10,&local_80);
      WalkLanguageTableElement(in_RSI,(RefAST *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
      RefCount<AST>::~RefCount(in_stack_ffffffffffffff00);
    }
  }
  return;
}

Assistant:

void GrcManager::WalkTableElement(RefAST ast, TableType tblt,
	GdlRuleTable * prultbl, GdlPass * ppass)
{
	int nodetyp = ast->getType();
	switch (nodetyp)
	{
	case LITERAL_environment:
		WalkEnvTree(ast, tblt, prultbl, ppass);
		break;
	case LITERAL_table:
		WalkTableTree(ast);
		break;
	case Zdirectives:
		WalkDirectivesTree(ast);
		break;
	case LITERAL_pass:
		Assert(prultbl);
		Assert(ktbltRule == tblt);
		WalkPassTree(ast, prultbl, ppass);
		break;
	case ZifStruct:
		Assert(prultbl);
		Assert(ktbltRule == tblt);
		WalkIfTree(ast, prultbl, ppass);
		break;
	case Zrule:
		Assert(prultbl);
		Assert(ktbltRule == tblt);
		WalkRuleTree(ast, prultbl, ppass);
		break;
	default:
		//	Assignment of some sort.
		switch (tblt)
		{
		case ktbltFeature:
			WalkFeatureTableElement(ast);
			break;
		case ktbltLanguage:
			WalkLanguageTableElement(ast);
			break;
		case ktbltName:
			WalkNameTableElement(ast);
			break;
		case ktbltGlyph:
			WalkGlyphTableElement(ast);
			break;
		case ktbltRule:
		default:
			Assert(false);
		}
	}
}